

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O1

void * outlet_anything(void *x,t_symbol *s,short ac,t_atom *av)

{
  t_mock_outlet *this;
  void *pvVar1;
  long *plVar2;
  bool bVar3;
  
  if (DAT_001144c8 != (long *)0x0) {
    plVar2 = DAT_001144c8;
    do {
      this = (t_mock_outlet *)plVar2[2];
      bVar3 = this == (t_mock_outlet *)plVar2[3];
      if (!bVar3) {
        pvVar1 = (void *)this->m_id;
        while (pvVar1 != x) {
          bVar3 = this + 1 == (t_mock_outlet *)plVar2[3];
          if (bVar3) goto LAB_0010b126;
          pvVar1 = (void *)this[1].m_id;
          this = this + 1;
        }
        c74::max::t_mock_outlet::push(this,s,(long)ac,av);
        if (!bVar3) {
          return (void *)0x1;
        }
      }
LAB_0010b126:
      plVar2 = (long *)*plVar2;
    } while (plVar2 != (long *)0x0);
  }
  return (void *)0x1;
}

Assistant:

MOCK_EXPORT void *outlet_anything(void *x, t_symbol *s, short ac, const t_atom *av)
{
    t_ptr_int outlet_id = (t_ptr_int)x;

    for (t_map_object_2_outlet_set::iterator i = g_object_to_outletset.begin(); i != g_object_to_outletset.end(); i++) {
        t_mock_outlets& outletset = i->second;

        for (t_mock_outlet_iter j = outletset.begin(); j != outletset.end(); j++) {
            t_mock_outlet& outlet = *j;

            if (outlet.get_id() == outlet_id) {
                outlet.push(s, ac, av);
                goto done;
            }
        }
    }
done:
    return (void*)1;
}